

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O0

CaseResult * rc::detail::toCaseResult(CaseResult *__return_storage_ptr__,string *value)

{
  ulong uVar1;
  string local_70;
  byte local_4d;
  byte local_3a;
  allocator local_39;
  string local_38;
  string *local_18;
  string *value_local;
  
  local_18 = value;
  value_local = (string *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  local_3a = 0;
  local_4d = 0;
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_70,(string *)value);
    CaseResult::CaseResult(__return_storage_ptr__,Failure,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string((string *)&local_38,"Returned empty string",&local_39);
    local_4d = 1;
    CaseResult::CaseResult(__return_storage_ptr__,Success,&local_38);
  }
  if ((local_4d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

CaseResult toCaseResult(std::string value) {
  return value.empty()
      ? CaseResult(CaseResult::Type::Success, "Returned empty string")
      : CaseResult(CaseResult::Type::Failure, std::move(value));
}